

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void XML_SetUserData(XML_Parser parser,void *p)

{
  void *p_local;
  XML_Parser parser_local;
  
  if (parser != (XML_Parser)0x0) {
    if (parser->m_handlerArg == parser->m_userData) {
      parser->m_userData = p;
      parser->m_handlerArg = p;
    }
    else {
      parser->m_userData = p;
    }
  }
  return;
}

Assistant:

void XMLCALL
XML_SetUserData(XML_Parser parser, void *p) {
  if (parser == NULL)
    return;
  if (parser->m_handlerArg == parser->m_userData)
    parser->m_handlerArg = parser->m_userData = p;
  else
    parser->m_userData = p;
}